

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_infix(gravity_parser_t *parser)

{
  gtoken_t op;
  size_t sVar1;
  gtoken_s token;
  _Bool _Var2;
  gnode_t *right;
  gnode_t *pgVar3;
  gnode_t *pgVar4;
  char *pcVar5;
  gnode_t *decl;
  gtoken_t token_00;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar6;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  
  token_00 = parser->current_token;
  uVar6 = (ulong)token_00;
  pgVar4 = parser->current_node;
  right = parse_precedence(parser,rules[uVar6].precedence - (uint)rules[uVar6].right);
  if ((uVar6 == 0x45) || (_Var2 = token_isassignment(token_00), !_Var2)) {
    sVar1 = parser->declarations->n;
    if (sVar1 == 0) {
      pgVar3 = (gnode_t *)0x0;
    }
    else {
      pgVar3 = parser->declarations->p[sVar1 - 1];
    }
  }
  else {
    if (9 < token_00 - TOK_OP_MUL_ASSIGN) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x484,
                    "gnode_t *adjust_assignment_expression(gravity_parser_t *, gtoken_t, gnode_t *, gnode_t *)"
                   );
    }
    op = *(gtoken_t *)(&DAT_001401f4 + (ulong)(token_00 - TOK_OP_MUL_ASSIGN) * 4);
    pgVar3 = gnode_duplicate(pgVar4,true);
    if (pgVar3 == (gnode_t *)0x0) {
      gravity_lexer_token(parser->lexer->p[parser->lexer->n - 1]);
      pcVar5 = token_name(token_00);
      token.lineno = uStack_4c;
      token.type = local_50;
      token.colno = uStack_48;
      token.position = uStack_44;
      token.bytes = local_40;
      token.length = uStack_3c;
      token.fileid = uStack_38;
      token.builtin = uStack_34;
      token.value = local_30;
      report_error(parser,GRAVITY_ERROR_SYNTAX,token,"An unexpected error occurred in %s",pcVar5,
                   in_R8,in_R9);
      return (gnode_t *)0x0;
    }
    sVar1 = parser->declarations->n;
    if (sVar1 == 0) {
      decl = (gnode_t *)0x0;
    }
    else {
      decl = parser->declarations->p[sVar1 - 1];
    }
    right = gnode_binary_expr_create(op,pgVar3,right,decl);
    sVar1 = parser->declarations->n;
    if (sVar1 == 0) {
      pgVar3 = (gnode_t *)0x0;
    }
    else {
      pgVar3 = parser->declarations->p[sVar1 - 1];
    }
    token_00 = TOK_OP_ASSIGN;
  }
  pgVar4 = gnode_binary_expr_create(token_00,pgVar4,right,pgVar3);
  return pgVar4;
}

Assistant:

static gnode_t *parse_infix (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_infix");

    gtoken_t tok = parser->current_token;
    gnode_t *lnode = parser->current_node;

    // we can make right associative operators by reducing the right binding power
    grammar_rule *rule = &rules[tok];
    prec_level precedence = (rule->right) ? rule->precedence-1 : rule->precedence;

    gnode_t *rnode = parse_precedence(parser, precedence);
    if ((tok != TOK_OP_ASSIGN) && token_isassignment(tok)) return adjust_assignment_expression(parser, tok, lnode, rnode);
    return gnode_binary_expr_create(tok, lnode, rnode, LAST_DECLARATION());
}